

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggressive_dead_code_elim_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::AggressiveDCEPass::AddDebugScopeToWorkList(AggressiveDCEPass *this,Instruction *inst)

{
  uint32_t uVar1;
  DebugScope *pDVar2;
  DefUseManager *pDVar3;
  Instruction *pIVar4;
  uint32_t inlined_at_id;
  uint32_t lex_scope_id;
  DebugScope scope;
  Instruction *inst_local;
  AggressiveDCEPass *this_local;
  
  scope = (DebugScope)inst;
  pDVar2 = opt::Instruction::GetDebugScope(inst);
  _inlined_at_id = *pDVar2;
  uVar1 = DebugScope::GetLexicalScope((DebugScope *)&inlined_at_id);
  if (uVar1 != 0) {
    pDVar3 = Pass::get_def_use_mgr((Pass *)this);
    pIVar4 = analysis::DefUseManager::GetDef(pDVar3,uVar1);
    AddToWorklist(this,pIVar4);
  }
  uVar1 = DebugScope::GetInlinedAt((DebugScope *)&inlined_at_id);
  if (uVar1 != 0) {
    pDVar3 = Pass::get_def_use_mgr((Pass *)this);
    pIVar4 = analysis::DefUseManager::GetDef(pDVar3,uVar1);
    AddToWorklist(this,pIVar4);
  }
  return;
}

Assistant:

void AggressiveDCEPass::AddDebugScopeToWorkList(const Instruction* inst) {
  auto scope = inst->GetDebugScope();
  auto lex_scope_id = scope.GetLexicalScope();
  if (lex_scope_id != kNoDebugScope)
    AddToWorklist(get_def_use_mgr()->GetDef(lex_scope_id));
  auto inlined_at_id = scope.GetInlinedAt();
  if (inlined_at_id != kNoInlinedAt)
    AddToWorklist(get_def_use_mgr()->GetDef(inlined_at_id));
}